

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

void ravi_dump_value(lua_State *L,TValue *stack_ptr)

{
  ushort uVar1;
  undefined8 in_RAX;
  uint uVar2;
  uint uVar3;
  GCObject *pGVar4;
  char *pcVar5;
  
  uVar1 = stack_ptr->tt_;
  if (uVar1 == 0x16) {
    pcVar5 = "light C function";
    goto LAB_00148f6c;
  }
  if (uVar1 == 0x8026) {
    pcVar5 = "C closure";
    goto LAB_00148f6c;
  }
  uVar3 = (uint)uVar1;
  if ((uVar3 & 0x7f) == 0x46) {
    pcVar5 = "fast C function";
    goto LAB_00148f6c;
  }
  if (uVar3 == 0x8006) {
    pcVar5 = "Lua closure";
    goto LAB_00148f6c;
  }
  uVar2 = uVar3 & 0xf;
  if (uVar2 == 6) {
    pcVar5 = "function";
    goto LAB_00148f6c;
  }
  uVar3 = uVar3 | 0x10;
  if (uVar3 == 0x8014) {
LAB_00148f7f:
    if ((short)uVar2 == 4) {
      if ((((stack_ptr->value_).gc)->tt & 0xf) == 4) {
        pGVar4 = (GCObject *)&(stack_ptr->value_).gc[1].tt;
        pcVar5 = "\'%s\'\n";
LAB_00148fa4:
        printf(pcVar5,pGVar4,(ulong)uVar3,in_RAX);
        return;
      }
      pcVar5 = "(((((stack_ptr)->value_).gc)->tt) & 0x0F) == 4";
    }
    else {
      pcVar5 = "(((((((stack_ptr))->tt_)) & 0x0F)) == (4))";
    }
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0xa4a,"void ravi_dump_value(lua_State *, const TValue *)");
  }
  if (uVar2 == 5) {
    pcVar5 = "table";
    goto LAB_00148f6c;
  }
  if (uVar2 == 4) goto LAB_00148f7f;
  if (uVar1 < 0x13) {
    switch(uVar1) {
    case 0:
      pcVar5 = "nil";
      break;
    case 1:
      pcVar5 = "boolean";
      break;
    case 2:
      pcVar5 = "light user data";
      break;
    case 3:
      printf("%.6f\n",(stack_ptr->value_).gc,stack_ptr,(ulong)uVar3,in_RAX);
      return;
    default:
      goto switchD_00148fd0_default;
    }
  }
  else {
    if (uVar1 == 0x13) {
      pGVar4 = (stack_ptr->value_).gc;
      pcVar5 = "%lld\n";
      goto LAB_00148fa4;
    }
    if (uVar1 == 0x8007) {
      pcVar5 = "full user data";
      goto LAB_00148f6c;
    }
    if (uVar1 == 0x8008) {
      pcVar5 = "thread";
      goto LAB_00148f6c;
    }
switchD_00148fd0_default:
    pcVar5 = "other";
  }
LAB_00148f6c:
  puts(pcVar5);
  return;
}

Assistant:

void ravi_dump_value(lua_State *L, const TValue *stack_ptr) {
  (void)L;
  if (ttisCclosure(stack_ptr))
    printf("C closure\n");
  else if (ttislcf(stack_ptr))
    printf("light C function\n");
  else if (ttisfcf(stack_ptr))
	printf("fast C function\n");
  else if (ttisLclosure(stack_ptr))
    printf("Lua closure\n");
  else if (ttisfunction(stack_ptr))
    printf("function\n");
  else if (ttislngstring(stack_ptr) || ttisshrstring(stack_ptr) ||
    ttisstring(stack_ptr))
    printf("'%s'\n", svalue(stack_ptr));
  else if (ttistable(stack_ptr))
    printf("table\n");
  else if (ttisnil(stack_ptr))
    printf("nil\n");
  else if (ttisfloat(stack_ptr))
    printf("%.6f\n", fltvalue(stack_ptr));
  else if (ttisinteger(stack_ptr))
    printf("%lld\n", (long long)ivalue(stack_ptr));
  else if (ttislightuserdata(stack_ptr))
    printf("light user data\n");
  else if (ttisfulluserdata(stack_ptr))
    printf("full user data\n");
  else if (ttisboolean(stack_ptr))
    printf("boolean\n");
  else if (ttisthread(stack_ptr))
    printf("thread\n");
  else
    printf("other\n");
}